

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UStringEnumeration::snext(UStringEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  UChar *srcChars;
  UnicodeString *pUVar2;
  UChar *str;
  UErrorCode *pUStack_20;
  int32_t length;
  UErrorCode *status_local;
  UStringEnumeration *this_local;
  
  pUStack_20 = status;
  status_local = (UErrorCode *)this;
  srcChars = uenum_unext_63(this->uenum,(int32_t *)((long)&str + 4),status);
  if ((srcChars != (UChar *)0x0) && (UVar1 = ::U_FAILURE(*pUStack_20), UVar1 == '\0')) {
    pUVar2 = UnicodeString::setTo(&(this->super_StringEnumeration).unistr,srcChars,str._4_4_);
    return pUVar2;
  }
  return (UnicodeString *)0x0;
}

Assistant:

const UnicodeString* UStringEnumeration::snext(UErrorCode& status) {
    int32_t length;
    const UChar* str = uenum_unext(uenum, &length, &status);
    if (str == 0 || U_FAILURE(status)) {
        return 0;
    }
    return &unistr.setTo(str, length);
}